

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEvent.c
# Opt level: O0

UpnpEvent * UpnpEvent_new(void)

{
  UpnpString *pUVar1;
  s_UpnpEvent *p;
  
  p = (s_UpnpEvent *)calloc(1,0x18);
  if (p == (s_UpnpEvent *)0x0) {
    p = (s_UpnpEvent *)0x0;
  }
  else {
    pUVar1 = UpnpString_new();
    p->m_SID = pUVar1;
  }
  return p;
}

Assistant:

UpnpEvent *UpnpEvent_new(void)
{
	struct s_UpnpEvent *p = calloc(1, sizeof(struct s_UpnpEvent));

	if (!p)
		return 0;

	/*p->m_EventKey = 0;*/
	/*p->m_ChangedVariables = 0;*/
	p->m_SID = UpnpString_new();

	return (UpnpEvent *)p;
}